

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

void __thiscall
nonstd::optional_lite::detail::storage_t<tinyusdz::ascii::AsciiParser::VariableDef>::destruct_value
          (storage_t<tinyusdz::ascii::AsciiParser::VariableDef> *this)

{
  if (*(code **)(this + 0x58) != (code *)0x0) {
    (**(code **)(this + 0x58))(this + 0x48,this + 0x48,3);
  }
  if (*(storage_t<tinyusdz::ascii::AsciiParser::VariableDef> **)(this + 0x20) != this + 0x30) {
    operator_delete(*(storage_t<tinyusdz::ascii::AsciiParser::VariableDef> **)(this + 0x20),
                    *(long *)(this + 0x30) + 1);
  }
  if (*(storage_t<tinyusdz::ascii::AsciiParser::VariableDef> **)this != this + 0x10) {
    operator_delete(*(storage_t<tinyusdz::ascii::AsciiParser::VariableDef> **)this,
                    *(long *)(this + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

void destruct_value()
    {
        value_ptr()->~T();
    }